

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O3

void If_LibBoxPrint(FILE *pFile,If_LibBox_t *p)

{
  undefined8 *puVar1;
  int iVar2;
  char *pcVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  pcVar3 = Extra_TimeStamp();
  fprintf((FILE *)pFile,"# Box library written by ABC on %s.\n",pcVar3);
  fwrite("# <Name> <ID> <Type> <I> <O>\n",0x1d,1,(FILE *)pFile);
  pVVar4 = p->vBoxes;
  if (0 < pVVar4->nSize) {
    lVar5 = 0;
    do {
      puVar1 = (undefined8 *)pVVar4->pArray[lVar5];
      if (puVar1 != (undefined8 *)0x0) {
        fprintf((FILE *)pFile,"%s %d %d %d %d\n",*puVar1,(ulong)*(uint *)((long)puVar1 + 0xc),
                (ulong)(*(char *)((long)puVar1 + 9) == '\0'),(ulong)*(uint *)(puVar1 + 2),
                *(undefined4 *)((long)puVar1 + 0x14));
        if (0 < *(int *)((long)puVar1 + 0x14)) {
          iVar6 = 0;
          do {
            iVar2 = *(int *)(puVar1 + 2);
            if (0 < iVar2) {
              lVar7 = 0;
              do {
                if (*(int *)(puVar1[3] + (iVar2 * iVar6 + lVar7) * 4) == -1000000000) {
                  fwrite("    - ",6,1,(FILE *)pFile);
                }
                else {
                  fprintf((FILE *)pFile,"%5d ");
                }
                iVar2 = *(int *)(puVar1 + 2);
                lVar7 = lVar7 + 1;
              } while ((int)lVar7 < iVar2);
            }
            iVar6 = iVar6 + 1;
            putchar(10);
          } while (iVar6 < *(int *)((long)puVar1 + 0x14));
        }
      }
      lVar5 = lVar5 + 1;
      pVVar4 = p->vBoxes;
    } while (lVar5 < pVVar4->nSize);
  }
  return;
}

Assistant:

void If_LibBoxPrint( FILE * pFile, If_LibBox_t * p )
{
    If_Box_t * pBox;
    int i, j, k;
    fprintf( pFile, "# Box library written by ABC on %s.\n", Extra_TimeStamp() );
    fprintf( pFile, "# <Name> <ID> <Type> <I> <O>\n" );
    If_LibBoxForEachBox( p, pBox, i )
    {
        fprintf( pFile, "%s %d %d %d %d\n", pBox->pName, pBox->Id, !pBox->fBlack, pBox->nPis, pBox->nPos );
        for ( j = 0; j < pBox->nPos; j++, printf("\n") )
            for ( k = 0; k < pBox->nPis; k++ )
                if ( pBox->pDelays[j * pBox->nPis + k] == -ABC_INFINITY )
                    fprintf( pFile, "    - " );
                else
                    fprintf( pFile, "%5d ", pBox->pDelays[j * pBox->nPis + k] );
    }
}